

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-dtoa.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::RoundWeedCounted
          (double_conversion *this,Vector<char> buffer,int length,uint64_t rest,uint64_t ten_kappa,
          uint64_t unit,int *kappa)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  ulong uVar3;
  int local_44;
  int i;
  uint64_t unit_local;
  uint64_t ten_kappa_local;
  uint64_t rest_local;
  undefined1 auStack_20 [4];
  int length_local;
  Vector<char> buffer_local;
  
  uVar3 = CONCAT44(in_register_0000000c,length);
  buffer_local.start_._0_4_ = buffer.start_._0_4_;
  _auStack_20 = this;
  if (uVar3 < rest) {
    if (ten_kappa < rest) {
      if (ten_kappa < rest - ten_kappa) {
        if ((uVar3 < rest - uVar3) && (ten_kappa << 1 <= rest + uVar3 * -2)) {
          buffer_local._15_1_ = 1;
        }
        else if ((ten_kappa < uVar3) && (rest - (uVar3 - ten_kappa) <= uVar3 - ten_kappa)) {
          pcVar2 = Vector<char>::operator[]((Vector<char> *)auStack_20,buffer.length_ + -1);
          *pcVar2 = *pcVar2 + '\x01';
          iVar1 = buffer.length_;
          while ((local_44 = iVar1 + -1, 0 < local_44 &&
                 (pcVar2 = Vector<char>::operator[]((Vector<char> *)auStack_20,local_44),
                 *pcVar2 == ':'))) {
            pcVar2 = Vector<char>::operator[]((Vector<char> *)auStack_20,local_44);
            *pcVar2 = '0';
            pcVar2 = Vector<char>::operator[]((Vector<char> *)auStack_20,iVar1 + -2);
            *pcVar2 = *pcVar2 + '\x01';
            iVar1 = local_44;
          }
          pcVar2 = Vector<char>::operator[]((Vector<char> *)auStack_20,0);
          if (*pcVar2 == ':') {
            pcVar2 = Vector<char>::operator[]((Vector<char> *)auStack_20,0);
            *pcVar2 = '1';
            *(int *)unit = *(int *)unit + 1;
          }
          buffer_local._15_1_ = 1;
        }
        else {
          buffer_local._15_1_ = 0;
        }
      }
      else {
        buffer_local._15_1_ = 0;
      }
    }
    else {
      buffer_local._15_1_ = 0;
    }
    return (bool)buffer_local._15_1_;
  }
  __assert_fail("rest < ten_kappa",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/fast-dtoa.cc"
                ,0xbb,
                "bool FIX::double_conversion::RoundWeedCounted(Vector<char>, int, uint64_t, uint64_t, uint64_t, int *)"
               );
}

Assistant:

static bool RoundWeedCounted(Vector<char> buffer,
                             int length,
                             uint64_t rest,
                             uint64_t ten_kappa,
                             uint64_t unit,
                             int* kappa) {
  ASSERT(rest < ten_kappa);
  // The following tests are done in a specific order to avoid overflows. They
  // will work correctly with any uint64 values of rest < ten_kappa and unit.
  //
  // If the unit is too big, then we don't know which way to round. For example
  // a unit of 50 means that the real number lies within rest +/- 50. If
  // 10^kappa == 40 then there is no way to tell which way to round.
  if (unit >= ten_kappa) return false;
  // Even if unit is just half the size of 10^kappa we are already completely
  // lost. (And after the previous test we know that the expression will not
  // over/underflow.)
  if (ten_kappa - unit <= unit) return false;
  // If 2 * (rest + unit) <= 10^kappa we can safely round down.
  if ((ten_kappa - rest > rest) && (ten_kappa - 2 * rest >= 2 * unit)) {
    return true;
  }
  // If 2 * (rest - unit) >= 10^kappa, then we can safely round up.
  if ((rest > unit) && (ten_kappa - (rest - unit) <= (rest - unit))) {
    // Increment the last digit recursively until we find a non '9' digit.
    buffer[length - 1]++;
    for (int i = length - 1; i > 0; --i) {
      if (buffer[i] != '0' + 10) break;
      buffer[i] = '0';
      buffer[i - 1]++;
    }
    // If the first digit is now '0'+ 10 we had a buffer with all '9's. With the
    // exception of the first digit all digits are now '0'. Simply switch the
    // first digit to '1' and adjust the kappa. Example: "99" becomes "10" and
    // the power (the kappa) is increased.
    if (buffer[0] == '0' + 10) {
      buffer[0] = '1';
      (*kappa) += 1;
    }
    return true;
  }
  return false;
}